

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O3

object __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::BrepFace>::get
          (PythonDataType<anurbs::Model,_anurbs::BrepFace> *this,Model *model,size_t index)

{
  handle hVar1;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  Model::get<anurbs::BrepFace>((Model *)&stack0xffffffffffffffe0,index);
  pVar2 = pybind11::detail::type_caster_generic::src_and_type
                    ((Model *)&stack0xffffffffffffffe0,(type_info *)&Ref<anurbs::BrepFace>::typeinfo
                     ,(type_info *)0x0);
  hVar1 = pybind11::detail::type_caster_generic::cast
                    (pVar2.first,copy,(handle)0x0,pVar2.second,
                     anon_func::anon_class_1_0_00000001::__invoke,
                     anon_func::anon_class_1_0_00000001::__invoke,(void *)0x0);
  (this->super_PythonDataTypeBase<anurbs::Model>)._vptr_PythonDataTypeBase =
       (_func_int **)hVar1.m_ptr;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return (object)(handle)this;
}

Assistant:

pybind11::object get(const TModel& model, const size_t index)
        override
    {
        return pybind11::cast(model.template get<TData>(index));
    }